

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O0

ON_2dVector * __thiscall ON_2dVector::operator=(ON_2dVector *this,float *v)

{
  float *v_local;
  ON_2dVector *this_local;
  
  if (v == (float *)0x0) {
    this->y = 0.0;
    this->x = 0.0;
  }
  else {
    this->x = (double)*v;
    this->y = (double)v[1];
  }
  return this;
}

Assistant:

ON_2dVector& ON_2dVector::operator=(const float* v)
{
  if ( v ) {
    x = (double)v[0];
    y = (double)v[1];
  }
  else {
    x = y = 0.0;
  }
  return *this;
}